

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatest.cpp
# Opt level: O0

bool TestPowerAmplifier(int curLine,AmpIO *Board,BasePort *Port,ofstream *logFile,uint qlaNum)

{
  ushort uVar1;
  ushort uVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  uint32_t uVar6;
  int iVar7;
  uint32_t uVar8;
  uint index;
  ostream *poVar9;
  void *pvVar10;
  char *local_118;
  char *local_100;
  unsigned_short newTemp2;
  undefined8 uStack_e8;
  unsigned_short newTemp1;
  unsigned_long cur [4];
  unsigned_short temp2;
  unsigned_short temp1;
  uint tempStart;
  bool motorEn;
  uint motorStart;
  uint32_t fver;
  bool pass;
  ulong uStack_a8;
  uint i;
  unsigned_long dac;
  unsigned_long status;
  char buf [100];
  uint qlaNum_local;
  ofstream *logFile_local;
  BasePort *Port_local;
  AmpIO *Board_local;
  int curLine_local;
  
  bVar3 = true;
  AmpIO::WriteWatchdogPeriod(Board,0);
  uVar6 = BoardIO::GetFirmwareVersion((BoardIO *)Board);
  poVar9 = (ostream *)std::ostream::operator<<(logFile,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<(poVar9,"=== Power Amplifier Test ===");
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  Amp1394Console::Print(curLine,9,"Temperature sensors - ");
  Amp1394Console::Refresh();
  AmpIO::WritePowerEnable(Board,true);
  iVar7 = 0;
  if (qlaNum == 2) {
    iVar7 = 4;
  }
  if (uVar6 < 8) {
    AmpIO::WriteAmpEnable(Board,0xf,0xf);
  }
  else {
    for (fver = 0; fver < 4; fver = fver + 1) {
      AmpIO::WriteAmpEnableAxis(Board,iVar7 + fver,true);
    }
  }
  uStack_a8 = 0x8000;
  for (fver = 0; fver < 4; fver = fver + 1) {
    AmpIO::SetMotorCurrent(Board,iVar7 + fver,0x8000);
  }
  (*Port->_vptr_BasePort[0x21])();
  Amp1394_Sleep(1.0);
  (*Port->_vptr_BasePort[0x1d])();
  Board_local._4_4_ = curLine;
  if (uVar6 < 8) {
    uVar8 = AmpIO::GetStatus(Board);
    if (((ulong)uVar8 & 0xc0f0f) != 0xc0f0f) {
      sprintf((char *)&status,"Failed to enable power (%08lx) - is motor power connected?",
              (ulong)uVar8);
      Board_local._4_4_ = curLine + 1;
      Amp1394Console::Print(curLine,9,(char *)&status);
    }
  }
  else {
    for (fver = 0; fver < 4; fver = fver + 1) {
      bVar4 = AmpIO::GetAmpEnable(Board,iVar7 + fver);
      if (!bVar4) {
        sprintf((char *)&status,"Failed to enable power - is motor power connected?");
        Board_local._4_4_ = curLine + 1;
        Amp1394Console::Print(curLine,9,(char *)&status);
        break;
      }
    }
  }
  Amp1394Console::Print(Board_local._4_4_,9,"Temperature sensors - ");
  index = 0;
  if (qlaNum == 2) {
    index = 2;
  }
  bVar5 = AmpIO::GetAmpTemperature(Board,index);
  cur[3]._6_2_ = bVar5 / 2;
  bVar5 = AmpIO::GetAmpTemperature(Board,index + 1);
  cur[3]._4_2_ = bVar5 / 2;
  poVar9 = std::operator<<((ostream *)logFile,"   Motor temperatures: ");
  pvVar10 = (void *)std::ostream::operator<<(poVar9,std::dec);
  poVar9 = (ostream *)std::ostream::operator<<(pvVar10,cur[3]._6_2_);
  poVar9 = std::operator<<(poVar9,", ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,cur[3]._4_2_);
  std::operator<<(poVar9," degC (expected range is 20-40) ");
  if ((((cur[3]._6_2_ < 0x14) || (0x28 < cur[3]._6_2_)) || (cur[3]._4_2_ < 0x14)) ||
     (0x28 < cur[3]._4_2_)) {
    poVar9 = std::operator<<((ostream *)logFile,"- FAIL");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    sprintf((char *)&status,"FAIL (%d, %d degC)",(ulong)cur[3]._6_2_,(ulong)cur[3]._4_2_);
  }
  else {
    poVar9 = std::operator<<((ostream *)logFile,"- PASS");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    sprintf((char *)&status,"PASS (%d, %d degC)",(ulong)cur[3]._6_2_,(ulong)cur[3]._4_2_);
  }
  Amp1394Console::Print(Board_local._4_4_,0x1f,(char *)&status);
  Amp1394Console::Print(Board_local._4_4_ + 1,9,"DAC:");
  Amp1394Console::Print(Board_local._4_4_ + 2,9,"ADC:");
  Amp1394Console::Print(Board_local._4_4_ + 4,9,"Temp:");
  Amp1394Console::Refresh();
  while( true ) {
    sprintf((char *)&status,"%04lx   %04lx   %04lx   %04lx",uStack_a8,uStack_a8,uStack_a8,uStack_a8)
    ;
    Amp1394Console::Print(Board_local._4_4_ + 1,0xf,(char *)&status);
    poVar9 = std::operator<<((ostream *)logFile,"   Commanded current: ");
    pvVar10 = (void *)std::ostream::operator<<(poVar9,std::hex);
    poVar9 = (ostream *)std::ostream::operator<<(pvVar10,uStack_a8);
    std::operator<<(poVar9,", Measured currents: ");
    for (fver = 0; fver < 4; fver = fver + 1) {
      uVar8 = AmpIO::GetMotorCurrent(Board,iVar7 + fver);
      cur[(ulong)fver - 1] = (ulong)uVar8;
      pvVar10 = (void *)std::ostream::operator<<(logFile,std::hex);
      std::ostream::operator<<(pvVar10,cur[(ulong)fver - 1]);
      if ((uStack_a8 + 0x100 < cur[(ulong)fver - 1]) ||
         ((0x100 < uStack_a8 && (cur[(ulong)fver - 1] < uStack_a8 - 0x100)))) {
        std::operator<<((ostream *)logFile,"* ");
        Amp1394Console::Print(Board_local._4_4_ + 3,fver * 7 + 0xf,"FAIL");
        bVar3 = false;
      }
      else {
        std::operator<<((ostream *)logFile,"  ");
        Amp1394Console::Print(Board_local._4_4_ + 3,fver * 7 + 0xf,"PASS");
      }
    }
    std::ostream::operator<<(logFile,std::endl<char,std::char_traits<char>>);
    sprintf((char *)&status,"%04lx   %04lx   %04lx   %04lx",uStack_e8,cur[0],cur[1],cur[2]);
    Amp1394Console::Print(Board_local._4_4_ + 2,0xf,(char *)&status);
    bVar5 = AmpIO::GetAmpTemperature(Board,index);
    uVar1 = bVar5 / 2;
    bVar5 = AmpIO::GetAmpTemperature(Board,index + 1);
    uVar2 = bVar5 / 2;
    poVar9 = std::operator<<((ostream *)logFile,"   Motor temperatures: ");
    pvVar10 = (void *)std::ostream::operator<<(poVar9,std::dec);
    poVar9 = (ostream *)std::ostream::operator<<(pvVar10,uVar1);
    poVar9 = std::operator<<(poVar9,", ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar2);
    std::operator<<(poVar9," degC (expected to be increasing)");
    if ((uVar1 < cur[3]._6_2_) || (uVar2 < cur[3]._4_2_)) {
      poVar9 = std::operator<<((ostream *)logFile," - fail");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar9 = std::operator<<((ostream *)logFile," - PASS");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    }
    if (uVar1 < cur[3]._6_2_) {
      local_100 = "FAIL";
    }
    else {
      local_100 = "PASS";
    }
    if (uVar2 < cur[3]._4_2_) {
      local_118 = "FAIL";
    }
    else {
      local_118 = "PASS";
    }
    sprintf((char *)&status,"%4d (%s)    %4d (%s)",(ulong)uVar1,local_100,(ulong)uVar2,local_118);
    Amp1394Console::Print(Board_local._4_4_ + 4,0xf,(char *)&status);
    cur[3]._4_2_ = uVar2;
    cur[3]._6_2_ = uVar1;
    Amp1394Console::Refresh();
    if (uStack_a8 < 0x8001) {
      uStack_a8 = 0x10200 - uStack_a8;
    }
    else {
      uStack_a8 = 0x8000 - (uStack_a8 - 0x8000);
    }
    if (0x8600 < uStack_a8) break;
    for (fver = 0; fver < 4; fver = fver + 1) {
      AmpIO::SetMotorCurrent(Board,iVar7 + fver,(uint32_t)uStack_a8);
    }
    (*Port->_vptr_BasePort[0x21])();
    Amp1394_Sleep(1.0);
    (*Port->_vptr_BasePort[0x1d])();
  }
  for (fver = 0; fver < 4; fver = fver + 1) {
    AmpIO::SetMotorCurrent(Board,iVar7 + fver,0x8000);
  }
  (*Port->_vptr_BasePort[0x21])();
  if (uVar6 < 8) {
    AmpIO::WriteAmpEnable(Board,0xf,0);
  }
  else {
    for (fver = 0; fver < 4; fver = fver + 1) {
      AmpIO::WriteAmpEnableAxis(Board,iVar7 + fver,false);
    }
  }
  AmpIO::WritePowerEnable(Board,false);
  AmpIO::WriteWatchdogPeriod(Board,0xffff);
  if (bVar3 == false) {
    poVar9 = std::operator<<((ostream *)logFile,"   Overall result: FAIL");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar9 = std::operator<<((ostream *)logFile,"   Overall result: PASS");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  }
  return bVar3;
}

Assistant:

bool TestPowerAmplifier(int curLine, AmpIO &Board, BasePort *Port, std::ofstream &logFile, unsigned int qlaNum)
{
    char buf[100];
    unsigned long status;
    unsigned long dac;
    unsigned int i;
    bool pass = true;

    // Disable watchdog
    Board.WriteWatchdogPeriod(0x0000);

    uint32_t fver = Board.GetFirmwareVersion();

    logFile << std::endl << "=== Power Amplifier Test ===" << std::endl;
    Amp1394Console::Print(curLine, 9, "Temperature sensors - ");
    Amp1394Console::Refresh();

    Board.WritePowerEnable(true);

    unsigned int motorStart = (qlaNum == 2) ? 4 : 0;

    // Enabling individual amplifiers
    if (fver < 8) {
        Board.WriteAmpEnable(0x0f, 0x0f);
    }
    else {
        for (i = 0; i < 4; i++)
            Board.WriteAmpEnableAxis(motorStart+i, true);
    }
    dac = 0x8000;
    for (i = 0; i < 4; i++)
        Board.SetMotorCurrent(motorStart+i, dac);
    Port->WriteAllBoards();
    Amp1394_Sleep(1.0);  // wait for power to stabilize
    Port->ReadAllBoards();
    if (fver < 8) {
        status = Board.GetStatus();
        if ((status&0x000c0f0f) != 0x000c0f0f) {
            sprintf(buf,"Failed to enable power (%08lx) - is motor power connected?", status);
            Amp1394Console::Print(curLine++, 9, buf);
        }
    }
    else {
        for (i = 0; i < 4; i++) {
            bool motorEn = Board.GetAmpEnable(motorStart+i);
            if (!motorEn) {
                sprintf(buf,"Failed to enable power - is motor power connected?");
                Amp1394Console::Print(curLine++, 9, buf);
                break;
            }
        }
    }
    Amp1394Console::Print(curLine, 9, "Temperature sensors - ");
    // Read temperature in Celsius
    unsigned int tempStart = (qlaNum == 2) ? 2 : 0;
    unsigned short temp1 = Board.GetAmpTemperature(tempStart)/2;
    unsigned short temp2 = Board.GetAmpTemperature(tempStart+1)/2;
    logFile << "   Motor temperatures: " << std::dec << temp1 << ", " << temp2 << " degC (expected range is 20-40) ";
    if ((temp1 < 20) || (temp1 > 40) || (temp2 < 20) || (temp2 > 40)) {
        logFile << "- FAIL" << std::endl;
        sprintf(buf, "FAIL (%d, %d degC)", temp1, temp2);
    }
    else {
        logFile << "- PASS" << std::endl;
        sprintf(buf, "PASS (%d, %d degC)", temp1, temp2);
    }
    Amp1394Console::Print(curLine++, 31, buf);

    Amp1394Console::Print(curLine, 9, "DAC:");
    Amp1394Console::Print(curLine+1, 9, "ADC:");
    Amp1394Console::Print(curLine+3, 9, "Temp:");
    Amp1394Console::Refresh();

    // Increment of 0x0200 is about 100 mA; 0x9000 is approx. 780 mA.
    unsigned long cur[4];
    while (1) {
        sprintf(buf, "%04lx   %04lx   %04lx   %04lx", dac, dac, dac, dac);
        Amp1394Console::Print(curLine, 15, buf);
        logFile << "   Commanded current: " << std::hex << dac << ", Measured currents: ";
        for (i = 0; i < 4; i++) {
            cur[i] = Board.GetMotorCurrent(motorStart+i);
            logFile << std::hex << cur[i];
            if ((cur[i] > (dac + 0x0100))
                || ((dac > 0x0100)
                    && (cur[i] < (dac - 0x0100))
                    )
                ) {
                logFile << "* ";
                Amp1394Console::Print(curLine+2, 15+7*i, "FAIL");
                pass = false;
            }
            else {
                logFile << "  ";
                Amp1394Console::Print(curLine+2, 15+7*i, "PASS");
            }
        }
        logFile << std::endl;
        sprintf(buf, "%04lx   %04lx   %04lx   %04lx", cur[0], cur[1], cur[2], cur[3]);
        Amp1394Console::Print(curLine+1, 15, buf);

        unsigned short newTemp1 = Board.GetAmpTemperature(tempStart)/2;
        unsigned short newTemp2 = Board.GetAmpTemperature(tempStart+1)/2;
        logFile << "   Motor temperatures: " << std::dec  << newTemp1 << ", " << newTemp2 << " degC (expected to be increasing)";
        if ((newTemp1 >= temp1) && (newTemp2 >= temp2))
            logFile << " - PASS" << std::endl;
        else
            logFile << " - fail" << std::endl;
        sprintf(buf, "%4d (%s)    %4d (%s)", newTemp1, ((newTemp1 >= temp1) ? "PASS" : "FAIL"),
                newTemp2, ((newTemp2 >= temp2) ? "PASS" : "FAIL"));
        Amp1394Console::Print(curLine+3, 15, buf);
        temp1 = newTemp1;
        temp2 = newTemp2;
        Amp1394Console::Refresh();

        if (dac > 0x8000) dac = 0x8000 - (dac - 0x8000);
        else dac = 0x8000 + (0x8000 - dac) + 0x0200;

        if (dac > 0x8600) break;

        for (i = 0; i < 4; i++)
            Board.SetMotorCurrent(motorStart+i, dac);
        Port->WriteAllBoards();
        Amp1394_Sleep(1.0);
        Port->ReadAllBoards();
    }

    for (i = 0; i < 4; i++)
        Board.SetMotorCurrent(motorStart+i, 0x8000);
    Port->WriteAllBoards();
    if (fver < 8) {
        Board.WriteAmpEnable(0x0f, 0);
    }
    else {
        for (i = 0; i < 4; i++)
            Board.WriteAmpEnableAxis(motorStart+i, false);
    }
    Board.WritePowerEnable(false);

    // Reenable watchdog
    Board.WriteWatchdogPeriod(0xFFFF);
    if (pass)
        logFile << "   Overall result: PASS" << std::endl;
    else
        logFile << "   Overall result: FAIL" << std::endl;
    return pass;
}